

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ShapeGeometry *this_00;
  aiAnimMesh *paVar9;
  bool bVar10;
  uint uVar11;
  MatIndexArray *this_01;
  aiMesh *out;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  size_type sVar12;
  ulong uVar13;
  aiVector3D *paVar14;
  const_iterator cVar15;
  const_iterator cVar16;
  size_type *psVar17;
  reference puVar18;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_04;
  size_type sVar19;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_05;
  const_reference pvVar20;
  const_reference v2;
  reference pvVar21;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *this_06;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *this_07;
  aiColor4D *paVar22;
  const_iterator __first;
  ImportSettings *pIVar23;
  const_reference pvVar24;
  Skin *pSVar25;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *this_08
  ;
  reference ppBVar26;
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  *this_09;
  reference ppBVar27;
  aiAnimMesh *paVar28;
  const_reference ppSVar29;
  string *name;
  const_reference pvVar30;
  uint *puVar31;
  aiAnimMesh **ppaVar32;
  reference ppaVar33;
  ulong uVar34;
  aiVector3t<float> aVar35;
  float local_498;
  aiColor4t<float> *local_3e8;
  aiVector3t<float> *local_3c0;
  aiVector3t<float> *local_398;
  aiVector3t<float> *local_370;
  aiVector3t<float> *local_310;
  aiFace *local_2d8;
  aiVector3t<float> *local_2b0;
  size_type local_290;
  size_t i_5;
  size_t numAnimMeshes;
  uint index_1;
  uint k;
  uint *outIndices;
  undefined1 auStack_268 [4];
  uint count;
  aiVector3D normal;
  aiVector3D vertex;
  uint index;
  size_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals_1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices_1;
  ShapeGeometry *shapeGeometry;
  aiAnimMesh *animMesh;
  size_t i_4;
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  *shapeGeometries;
  BlendShapeChannel *blendShapeChannel;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  *__range3_1;
  BlendShape *blendShape;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  *__range2_1;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors;
  uint i_3;
  undefined4 local_16c;
  reference local_168;
  aiVector2D *v;
  const_iterator __end3;
  const_iterator __begin3;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *__range3;
  aiVector3D *out_uv;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *uvs;
  uint i_2;
  uint local_f0;
  uint i_1;
  undefined1 local_e0 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *binormals;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *tangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals;
  uint i;
  aiFace *f;
  const_iterator cStack_88;
  uint pcount;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  aiFace *paStack_68;
  uint cursor;
  aiFace *fac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices;
  aiMesh *out_mesh;
  MatIndexArray *mindices;
  aiNode *nd_local;
  aiMatrix4x4 *node_global_transform_local;
  Model *model_local;
  MeshGeometry *mesh_local;
  FBXConverter *this_local;
  
  this_01 = MeshGeometry::GetMaterialIndices(mesh);
  out = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  this_02 = MeshGeometry::GetVertices(mesh);
  this_03 = MeshGeometry::GetFaceIndexCounts(mesh);
  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
  out->mNumVertices = (uint)sVar12;
  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar12;
  uVar13 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  paVar14 = (aiVector3D *)operator_new__(uVar13);
  if (sVar12 != 0) {
    local_2b0 = paVar14;
    do {
      aiVector3t<float>::aiVector3t(local_2b0);
      local_2b0 = local_2b0 + 1;
    } while (local_2b0 != paVar14 + sVar12);
  }
  out->mVertices = paVar14;
  cVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(this_02);
  cVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(this_02);
  std::
  copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
            ((__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
              )cVar15._M_current,
             (__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
              )cVar16._M_current,out->mVertices);
  sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_03);
  out->mNumFaces = (uint)sVar12;
  sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_03);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar12;
  uVar13 = SUB168(auVar2 * ZEXT816(0x10),0);
  uVar34 = uVar13 + 8;
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar13) {
    uVar34 = 0xffffffffffffffff;
  }
  psVar17 = (size_type *)operator_new__(uVar34);
  *psVar17 = sVar12;
  paStack_68 = (aiFace *)(psVar17 + 1);
  if (sVar12 != 0) {
    local_2d8 = paStack_68;
    do {
      aiFace::aiFace(local_2d8);
      local_2d8 = local_2d8 + 1;
    } while (local_2d8 != paStack_68 + sVar12);
  }
  out->mFaces = paStack_68;
  __range2._4_4_ = 0;
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_03);
  cStack_88 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_03);
  while (bVar10 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78), bVar10) {
    puVar18 = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&__end2);
    uVar11 = *puVar18;
    paStack_68->mNumIndices = uVar11;
    puVar31 = (uint *)operator_new__((ulong)uVar11 << 2);
    paStack_68->mIndices = puVar31;
    if (uVar11 == 1) {
      out->mPrimitiveTypes = out->mPrimitiveTypes | 1;
    }
    else if (uVar11 == 2) {
      out->mPrimitiveTypes = out->mPrimitiveTypes | 2;
    }
    else if (uVar11 == 3) {
      out->mPrimitiveTypes = out->mPrimitiveTypes | 4;
    }
    else {
      out->mPrimitiveTypes = out->mPrimitiveTypes | 8;
    }
    for (normals._4_4_ = 0; normals._4_4_ < uVar11; normals._4_4_ = normals._4_4_ + 1) {
      paStack_68->mIndices[normals._4_4_] = __range2._4_4_;
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
    paStack_68 = paStack_68 + 1;
  }
  this_04 = MeshGeometry::GetNormals(mesh);
  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
  if (sVar12 != 0) {
    sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
    sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    if (sVar12 != sVar19) {
      __assert_fail("normals.size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0x444,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar12;
    uVar13 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    paVar14 = (aiVector3D *)operator_new__(uVar13);
    if (sVar12 != 0) {
      local_310 = paVar14;
      do {
        aiVector3t<float>::aiVector3t(local_310);
        local_310 = local_310 + 1;
      } while (local_310 != paVar14 + sVar12);
    }
    out->mNormals = paVar14;
    cVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(this_04);
    cVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(this_04);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              ((__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                )cVar15._M_current,
               (__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                )cVar16._M_current,out->mNormals);
  }
  this_05 = MeshGeometry::GetTangents(mesh);
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)MeshGeometry::GetBinormals(mesh);
  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_05);
  if (sVar12 != 0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_e0);
    sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        tempBinormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar12 == 0) {
      sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
      if (sVar12 == 0) {
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_e0,sVar12
                  );
        for (local_f0 = 0;
            sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                               (this_05), local_f0 < sVar12; local_f0 = local_f0 + 1) {
          pvVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              (this_04,(ulong)local_f0);
          v2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (this_05,(ulong)local_f0);
          aVar35 = operator^(pvVar20,v2);
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_e0,(ulong)local_f0);
          pvVar21->x = (float)(int)aVar35._0_8_;
          pvVar21->y = (float)(int)((ulong)aVar35._0_8_ >> 0x20);
          pvVar21->z = aVar35.z;
        }
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e0;
      }
    }
    if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_05);
      sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      if (sVar12 != sVar19) {
        __assert_fail("tangents.size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0x461,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                     );
      }
      sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          tempBinormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      if (sVar12 != sVar19) {
        __assert_fail("binormals->size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0x462,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                     );
      }
      sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar12;
      uVar13 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      paVar14 = (aiVector3D *)operator_new__(uVar13);
      if (sVar12 != 0) {
        local_370 = paVar14;
        do {
          aiVector3t<float>::aiVector3t(local_370);
          local_370 = local_370 + 1;
        } while (local_370 != paVar14 + sVar12);
      }
      out->mTangents = paVar14;
      cVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(this_05);
      cVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(this_05);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
                ((__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )cVar15._M_current,
                 (__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )cVar16._M_current,out->mTangents);
      sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar12;
      uVar13 = SUB168(auVar5 * ZEXT816(0xc),0);
      if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      paVar14 = (aiVector3D *)operator_new__(uVar13);
      if (sVar12 != 0) {
        local_398 = paVar14;
        do {
          aiVector3t<float>::aiVector3t(local_398);
          local_398 = local_398 + 1;
        } while (local_398 != paVar14 + sVar12);
      }
      out->mBitangents = paVar14;
      cVar15 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          tempBinormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          tempBinormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
                ((__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )cVar15._M_current,
                 (__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )cVar16._M_current,out->mBitangents);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_e0);
  }
  for (uvs._4_4_ = 0; uvs._4_4_ < 8; uvs._4_4_ = uvs._4_4_ + 1) {
    this_06 = MeshGeometry::GetTextureCoords(mesh,uvs._4_4_);
    bVar10 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty(this_06);
    if (bVar10) break;
    sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sVar12;
    uVar13 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    __range3 = (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
               operator_new__(uVar13);
    if (sVar12 != 0) {
      local_3c0 = (aiVector3t<float> *)__range3;
      do {
        aiVector3t<float>::aiVector3t(local_3c0);
        local_3c0 = local_3c0 + 1;
      } while (local_3c0 != (aiVector3D *)((long)__range3 + sVar12 * 0xc));
    }
    out->mTextureCoords[uvs._4_4_] = (aiVector3D *)__range3;
    __end3 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::begin(this_06);
    v = (aiVector2D *)
        std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::end(this_06);
    while (bVar10 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_aiVector2t<float>_*,_std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>_>
                                        *)&v), bVar10) {
      local_168 = __gnu_cxx::
                  __normal_iterator<const_aiVector2t<float>_*,_std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>_>
                  ::operator*(&__end3);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)((long)&colors + 4),local_168->x,local_168->y,0.0);
      (__range3->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)._M_impl
      .super__Vector_impl_data._M_start = stack0xfffffffffffffe8c;
      *(undefined4 *)
       &(__range3->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = local_16c;
      __gnu_cxx::
      __normal_iterator<const_aiVector2t<float>_*,_std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>_>
      ::operator++(&__end3);
      __range3 = (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                 ((long)&(__range3->
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
    }
    out->mNumUVComponents[uvs._4_4_] = 2;
  }
  for (colors._0_4_ = 0; (uint)colors < 8; colors._0_4_ = (uint)colors + 1) {
    this_07 = MeshGeometry::GetVertexColors(mesh,(uint)colors);
    bVar10 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty(this_07);
    if (bVar10) break;
    sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = sVar12;
    uVar13 = SUB168(auVar7 * ZEXT816(0x10),0);
    if (SUB168(auVar7 * ZEXT816(0x10),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    paVar22 = (aiColor4D *)operator_new__(uVar13);
    if (sVar12 != 0) {
      local_3e8 = paVar22;
      do {
        aiColor4t<float>::aiColor4t(local_3e8);
        local_3e8 = local_3e8 + 1;
      } while (local_3e8 != paVar22 + sVar12);
    }
    out->mColors[(uint)colors] = paVar22;
    __first = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin(this_07);
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end(this_07);
    std::
    copy<__gnu_cxx::__normal_iterator<aiColor4t<float>const*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>,aiColor4t<float>*>
              ((__normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                )__first._M_current,
               (__normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                )animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,out->mColors[(uint)colors]);
  }
  pIVar23 = Document::Settings(this->doc);
  if (((pIVar23->readMaterials & 1U) == 0) ||
     (bVar10 = std::vector<int,_std::allocator<int>_>::empty(this_01), bVar10)) {
    LogFunctions<Assimp::FBXImporter>::LogError
              ("no material assigned to mesh, setting default material");
    uVar11 = GetDefaultMaterial(this);
    out->mMaterialIndex = uVar11;
  }
  else {
    pvVar24 = std::vector<int,_std::allocator<int>_>::operator[](this_01,0);
    ConvertMaterialForMesh(this,out,model,mesh,*pvVar24);
  }
  pIVar23 = Document::Settings(this->doc);
  if (((pIVar23->readWeights & 1U) != 0) &&
     (pSVar25 = Geometry::DeformerSkin(&mesh->super_Geometry), pSVar25 != (Skin *)0x0)) {
    ConvertWeights(this,out,model,mesh,node_global_transform,0xffffffff,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  }
  std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::vector
            ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2_1);
  this_08 = Geometry::GetBlendShapes(&mesh->super_Geometry);
  __end2_1 = std::
             vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             ::begin(this_08);
  blendShape = (BlendShape *)
               std::
               vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
               ::end(this_08);
  while (bVar10 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<const_Assimp::FBX::BlendShape_*const_*,_std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>_>
                              *)&blendShape), bVar10) {
    ppBVar26 = __gnu_cxx::
               __normal_iterator<const_Assimp::FBX::BlendShape_*const_*,_std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>_>
               ::operator*(&__end2_1);
    this_09 = BlendShape::BlendShapeChannels(*ppBVar26);
    __end3_1 = std::
               vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
               ::begin(this_09);
    blendShapeChannel =
         (BlendShapeChannel *)
         std::
         vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
         ::end(this_09);
    while (bVar10 = __gnu_cxx::operator!=
                              (&__end3_1,
                               (__normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
                                *)&blendShapeChannel), bVar10) {
      ppBVar27 = __gnu_cxx::
                 __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
                 ::operator*(&__end3_1);
      shapeGeometries =
           (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            *)*ppBVar27;
      i_4 = (size_t)BlendShapeChannel::GetShapeGeometries((BlendShapeChannel *)shapeGeometries);
      for (animMesh = (aiAnimMesh *)0x0; paVar9 = animMesh,
          paVar28 = (aiAnimMesh *)
                    std::
                    vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                    ::size((vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                            *)i_4), paVar9 < paVar28;
          animMesh = (aiAnimMesh *)((long)&(animMesh->mName).length + 1)) {
        shapeGeometry = (ShapeGeometry *)aiCreateAnimMesh(out);
        ppSVar29 = std::
                   vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   ::at((vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                         *)i_4,(size_type)animMesh);
        vertices_1 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)*ppSVar29;
        normals_1 = ShapeGeometry::GetVertices((ShapeGeometry *)vertices_1);
        indices = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ShapeGeometry::GetNormals((ShapeGeometry *)vertices_1);
        local_220 = ShapeGeometry::GetIndices((ShapeGeometry *)vertices_1);
        this_00 = shapeGeometry;
        name = FBX::Object::Name_abi_cxx11_((Object *)vertices_1);
        FixAnimMeshName((string *)&j,this,name);
        aiString::Set((aiString *)this_00,(string *)&j);
        std::__cxx11::string::~string((string *)&j);
        for (stack0xfffffffffffffdb8 = 0;
            sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_220),
            stack0xfffffffffffffdb8 < sVar12; register0x00000000 = stack0xfffffffffffffdb8 + 1) {
          pvVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (local_220,stack0xfffffffffffffdb8);
          uVar11 = *pvVar30;
          pvVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              (normals_1,stack0xfffffffffffffdb8);
          normal.z = pvVar20->x;
          unique0x00012004 = pvVar20->y;
          pvVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               indices,stack0xfffffffffffffdb8);
          normal.x = pvVar20->z;
          auStack_268 = pvVar20->x;
          unique0x00012004 = pvVar20->y;
          outIndices._4_4_ = 0;
          puVar31 = MeshGeometry::ToOutputVertexIndex(mesh,uVar11,(uint *)((long)&outIndices + 4));
          for (numAnimMeshes._4_4_ = 0; numAnimMeshes._4_4_ < outIndices._4_4_;
              numAnimMeshes._4_4_ = numAnimMeshes._4_4_ + 1) {
            uVar11 = puVar31[numAnimMeshes._4_4_];
            aiVector3t<float>::operator+=
                      ((aiVector3t<float> *)
                       ((long)shapeGeometry[6].super_Geometry.blendShapes.
                              super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish + (ulong)uVar11 * 0xc),
                       (aiVector3t<float> *)&normal.z);
            if (shapeGeometry[6].super_Geometry.blendShapes.
                super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)
                         ((long)shapeGeometry[6].super_Geometry.blendShapes.
                                super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                         (ulong)uVar11 * 0xc),(aiVector3t<float> *)auStack_268);
              aiVector3t<float>::NormalizeSafe
                        ((aiVector3t<float> *)
                         ((long)shapeGeometry[6].super_Geometry.blendShapes.
                                super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                         (ulong)uVar11 * 0xc));
            }
          }
        }
        sVar12 = std::
                 vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                 ::size((vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                         *)i_4);
        if (sVar12 < 2) {
          local_498 = 1.0;
        }
        else {
          local_498 = BlendShapeChannel::DeformPercent((BlendShapeChannel *)shapeGeometries);
          local_498 = local_498 / 100.0;
        }
        *(float *)((long)&shapeGeometry[7].super_Geometry.blendShapes.
                          super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = local_498;
        std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back
                  ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2_1,
                   (value_type *)&shapeGeometry);
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
      ::operator++(&__end3_1);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::BlendShape_*const_*,_std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>_>
    ::operator++(&__end2_1);
  }
  sVar12 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::size
                     ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2_1);
  if (sVar12 != 0) {
    i_5._0_4_ = (uint)sVar12;
    out->mNumAnimMeshes = (uint)i_5;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sVar12;
    uVar13 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    ppaVar32 = (aiAnimMesh **)operator_new__(uVar13);
    out->mAnimMeshes = ppaVar32;
    for (local_290 = 0; local_290 < sVar12; local_290 = local_290 + 1) {
      ppaVar33 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at
                           ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2_1,
                            local_290);
      out->mAnimMeshes[local_290] = *ppaVar33;
    }
  }
  sVar12 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
  std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~vector
            ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2_1);
  return (int)sVar12 - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[vertices.size()];

            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            // generate dummy faces
            out_mesh->mNumFaces = static_cast<unsigned int>(faces.size());
            aiFace* fac = out_mesh->mFaces = new aiFace[faces.size()]();

            unsigned int cursor = 0;
            for (unsigned int pcount : faces) {
                aiFace& f = *fac++;
                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i) {
                    f.mIndices[i] = cursor++;
                }
            }

            // copy normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());

                out_mesh->mNormals = new aiVector3D[vertices.size()];
                std::copy(normals.begin(), normals.end(), out_mesh->mNormals);
            }

            // copy tangents - assimp requires both tangents and bitangents (binormals)
            // to be present, or neither of them. Compute binormals from normals
            // and tangents if needed.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();

            if (tangents.size()) {
                std::vector<aiVector3D> tempBinormals;
                if (!binormals->size()) {
                    if (normals.size()) {
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size());
                    ai_assert(binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    std::copy(tangents.begin(), tangents.end(), out_mesh->mTangents);

                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                    std::copy(binormals->begin(), binormals->end(), out_mesh->mBitangents);
                }
            }

            // copy texture coords
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                aiVector3D* out_uv = out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                for (const aiVector2D& v : uvs) {
                    *out_uv++ = aiVector3D(v.x, v.y, 0.0f);
                }

                out_mesh->mNumUVComponents[i] = 2;
            }

            // copy vertex colors
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
                std::copy(colors.begin(), colors.end(), out_mesh->mColors[i]);
            }

            if (!doc.Settings().readMaterials || mindices.empty()) {
                FBXImporter::LogError("no material assigned to mesh, setting default material");
                out_mesh->mMaterialIndex = GetDefaultMaterial();
            }
            else {
                ConvertMaterialForMesh(out_mesh, model, mesh, mindices[0]);
            }

            if (doc.Settings().readWeights && mesh.DeformerSkin() != NULL) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, NO_MATERIAL_SEPARATION);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh *animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int index = outIndices[k];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }
            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }
            return static_cast<unsigned int>(meshes.size() - 1);
        }